

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O2

IndexedMatrixArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedMatrixArray *y,IndexedMatrixArray *u,Matrix *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt,IndexedMatrixArray *ino,IndexedMatrixArray *premea)

{
  undefined4 *puVar1;
  IndexedMatrixArray *this;
  Matrix *v;
  uint uVar2;
  uint uVar3;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  undefined4 in_register_0000000c;
  long lVar4;
  ulong uVar5;
  IndexedMatrixArray *in_stack_00000010;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  local_63b [3];
  IndexedMatrixArray *local_638;
  void *local_630 [4];
  Matrix Q;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_5f8;
  Matrix *local_5c0;
  IndexedMatrixArray *local_5b8;
  IndexedMatrixArray *local_5b0;
  double local_5a8;
  Matrix R;
  undefined4 local_588;
  undefined4 uStack_584;
  undefined4 uStack_580;
  undefined4 uStack_57c;
  undefined8 local_578;
  FixedContactEKFFlexEstimatorIMU estimator;
  
  local_5b8 = (IndexedMatrixArray *)xh0;
  local_5b0 = ino;
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  FixedContactEKFFlexEstimatorIMU(&estimator,0.005);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getRmatrixIdentity();
  local_630[0] = (void *)0x3c9cd2b297d889bc;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_5f8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&R,(double *)local_630
            );
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            (&R,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&local_5f8);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getQmatrixIdentity();
  local_630[0] = (void *)0x3f1a36e2eb1c432d;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_5f8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Q,(double *)local_630
            );
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            (&Q,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&local_5f8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_5a8 = 0.01;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)local_630,local_63b,&local_5a8);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            (&local_5f8,&Q,6,6,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            (&local_5f8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)local_630);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_5a8 = 0.01;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)local_630,local_63b,&local_5a8);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            (&local_5f8,&Q,0xf,0xf,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            (&local_5f8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)local_630);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setFlexibilityCovariance
            ((Matrix *)&estimator);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  setMeasurementNoiseCovariance((Matrix *)&estimator);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  setProcessNoiseCovariance((Matrix *)&estimator);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setContactsNumber
            ((uint)&estimator);
  lVar4 = 0;
  local_638 = y;
  local_5c0 = (Matrix *)CONCAT44(in_register_0000000c,numberOfContacts);
  for (uVar5 = 0; v = local_5c0, ((ulong)contactsPositions & 0xffffffff) != uVar5; uVar5 = uVar5 + 1
      ) {
    local_578 = *(undefined8 *)(*(long *)local_5b0 + 0x10 + lVar4);
    puVar1 = (undefined4 *)(*(long *)local_5b0 + lVar4);
    local_588 = *puVar1;
    uStack_584 = puVar1[1];
    uStack_580 = puVar1[2];
    uStack_57c = puVar1[3];
    stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setContactPosition
              (&estimator,uVar5 & 0xffffffff,&local_588);
    lVar4 = lVar4 + 0x18;
  }
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setFlexibilityGuess
            ((Matrix *)&estimator);
  this = local_638;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_638);
  uVar2 = IndexedMatrixArray::getFirstIndex(u);
  IndexedMatrixArray::setValue(this,v,uVar2 - 1);
  uVar2 = IndexedMatrixArray::getFirstIndex(u);
  while( true ) {
    uVar3 = IndexedMatrixArray::getLastIndex(u);
    if (uVar3 < uVar2) break;
    IndexedMatrixArray::operator[]((Matrix *)&local_5f8,u,uVar2);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_630,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5f8);
    stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)&estimator);
    free(local_630[0]);
    free(local_5f8.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
         m_data);
    IndexedMatrixArray::operator[]((Matrix *)&local_5f8,local_5b8,uVar2);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_630,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5f8);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)&estimator);
    free(local_630[0]);
    free(local_5f8.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
         m_data);
    other = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
            getFlexibilityVector();
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5f8,other);
    IndexedMatrixArray::pushBack(this,(Matrix *)&local_5f8);
    free(local_5f8.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
         m_data);
    if (premea != (IndexedMatrixArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInovation();
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5f8,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_630);
      IndexedMatrixArray::setValue(premea,(Matrix *)&local_5f8,uVar2);
      free(local_5f8.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_data);
      free(local_630[0]);
    }
    if (in_stack_00000010 != (IndexedMatrixArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getPredictedMeasurement
                ();
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5f8,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_630);
      IndexedMatrixArray::setValue(in_stack_00000010,(Matrix *)&local_5f8,uVar2);
      free(local_5f8.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_data);
      free(local_630[0]);
    }
    uVar2 = uVar2 + 1;
  }
  free(Q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  ~FixedContactEKFFlexEstimatorIMU(&estimator);
  return this;
}

Assistant:

stateObservation::IndexedMatrixArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedMatrixArray & y,
            const stateObservation::IndexedMatrixArray & u,
            const Matrix & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3,Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt,
            IndexedMatrixArray * ino,
            IndexedMatrixArray * premea)
{

    (void)dt;
        ///Sizes of the states for the state, the measurement, and the input vector

    flexibilityEstimation::FixedContactEKFFlexEstimatorIMU estimator;


    Matrix R(estimator.getEKF().getRmatrixIdentity());
    R=R*1.e-16;

    Matrix Q(estimator.getEKF().getQmatrixIdentity());
    Q=Q*1.e-4;
    Q.block(6,6,3,3)=Matrix3::Identity()*1.e-2;
    Q.block(15,15,3,3)=Matrix3::Identity()*1.e-2;


    estimator.setFlexibilityCovariance(Q);
    estimator.setMeasurementNoiseCovariance(R);
    estimator.setProcessNoiseCovariance(Q);


    estimator.setContactsNumber(numberOfContacts);

    for (unsigned i = 0; i<numberOfContacts ; ++i)
    {
        estimator.setContactPosition(i,contactsPositions[i]);
    }

    ///
    estimator.setFlexibilityGuess(xh0);

    ///the array of the state estimations over time
    stateObservation::IndexedMatrixArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (unsigned i=y.getFirstIndex();i<=y.getLastIndex();++i)
    {
        //std::cout << i << std::endl;

        ///introduction of the measurement
        estimator.setMeasurement(y[i]);

        estimator.setMeasurementInput(u[i]);

        ///get the estimation and give it to the array
        xh.pushBack(estimator.getFlexibilityVector());

        if (ino != 0)
        {
            ino->setValue(estimator.getInovation(),i);
        }

        if (premea != 0)
        {
            premea->setValue(estimator.getPredictedMeasurement(),i);
        }

    }

    return xh;
}